

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O2

void __thiscall QAbstractAnimation::setCurrentTime(QAbstractAnimation *this,int msecs)

{
  QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
  *this_00;
  QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
  *this_01;
  uint uVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  parameter_type pVar6;
  parameter_type pVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  
  lVar3 = *(long *)(this + 8);
  iVar8 = 0;
  if (msecs < 1) {
    msecs = 0;
  }
  uVar5 = (**(code **)(*(long *)this + 0x60))();
  pVar6 = QObjectBindableProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_loopCount_offset,_nullptr>
          ::value((QObjectBindableProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_loopCount_offset,_nullptr>
                   *)(lVar3 + 0x88));
  uVar9 = 0xffffffff;
  if (-1 < pVar6) {
    uVar9 = pVar6 * uVar5;
  }
  if ((int)uVar5 < 1) {
    uVar9 = uVar5;
  }
  uVar4 = msecs;
  if ((int)uVar9 < msecs) {
    uVar4 = uVar9;
  }
  if (uVar9 == 0xffffffff) {
    uVar4 = msecs;
  }
  uVar10 = (ulong)uVar4;
  this_00 = (QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
             *)(lVar3 + 0x80);
  QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
  ::removeBindingUnlessInWrapper(this_00);
  uVar1 = *(uint *)(lVar3 + 0x80);
  *(uint *)(lVar3 + 0x80) = uVar4;
  pVar7 = QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
          ::value((QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
                   *)(lVar3 + 0x7c));
  iVar2 = *(int *)(lVar3 + 0x8c);
  if (0 < (int)uVar5) {
    iVar8 = (int)uVar4 / (int)uVar5;
  }
  this_01 = (QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
             *)(lVar3 + 0x8c);
  if (iVar8 == pVar6) {
    uVar10 = 0;
    if (0 < (int)uVar5) {
      uVar10 = (ulong)uVar5;
    }
    *(int *)(lVar3 + 0x84) = (int)uVar10;
    iVar8 = 1;
    if (1 < pVar6) {
      iVar8 = pVar6;
    }
    iVar8 = iVar8 + -1;
  }
  else if (pVar7 == Forward) {
    if (0 < (int)uVar5) {
      uVar10 = (long)(int)uVar4 % (long)(int)uVar5 & 0xffffffff;
    }
    *(int *)(lVar3 + 0x84) = (int)uVar10;
  }
  else {
    if (0 < (int)uVar5) {
      uVar10 = (ulong)((int)(uVar4 - 1) % (int)uVar5 + 1);
    }
    *(uint *)(lVar3 + 0x84) = (uint)uVar10;
    iVar8 = iVar8 - (uint)((uint)uVar10 == uVar5);
  }
  (this_01->super_QPropertyData<int>).val = iVar8;
  (**(code **)(*(long *)this + 0x68))(this,uVar10);
  iVar8 = (this_01->super_QPropertyData<int>).val;
  pVar7 = QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
          ::value((QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
                   *)(lVar3 + 0x7c));
  uVar5 = (this_00->super_QPropertyData<int>).val;
  if (iVar8 != iVar2) {
    QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
    ::notify(this_01);
  }
  if (uVar1 != uVar5) {
    QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
    ::notify(this_00);
  }
  if (((pVar7 != Forward) || (uVar5 != uVar9)) && (pVar7 != Backward || uVar5 != 0)) {
    return;
  }
  stop(this);
  return;
}

Assistant:

void QAbstractAnimation::setCurrentTime(int msecs)
{
    Q_D(QAbstractAnimation);
    msecs = qMax(msecs, 0);

    // Calculate new time and loop.
    const int dura = duration();
    const int totalLoopCount = d->loopCount;
    const int totalDura = dura <= 0 ? dura : ((totalLoopCount < 0) ? -1 : dura * totalLoopCount);
    if (totalDura != -1)
        msecs = qMin(totalDura, msecs);

    d->totalCurrentTime.removeBindingUnlessInWrapper();

    const int oldCurrentTime = d->totalCurrentTime.valueBypassingBindings();
    d->totalCurrentTime.setValueBypassingBindings(msecs);

    QAbstractAnimation::Direction currentDirection = d->direction;

    // Update new values.
    const int oldLoop = d->currentLoop.valueBypassingBindings();
    int newCurrentLoop = (dura <= 0) ? 0 : (msecs / dura);
    if (newCurrentLoop == totalLoopCount) {
        //we're at the end
        d->currentTime = qMax(0, dura);
        newCurrentLoop = qMax(0, totalLoopCount - 1);
    } else {
        if (currentDirection == Forward) {
            d->currentTime = (dura <= 0) ? msecs : (msecs % dura);
        } else {
            d->currentTime = (dura <= 0) ? msecs : ((msecs - 1) % dura) + 1;
            if (d->currentTime == dura)
                newCurrentLoop = newCurrentLoop - 1;
        }
    }
    d->currentLoop.setValueBypassingBindings(newCurrentLoop);

    // this is a virtual function, so it can update the properties as well
    updateCurrentTime(d->currentTime);

    // read the property values again
    newCurrentLoop = d->currentLoop.valueBypassingBindings();
    currentDirection = d->direction;
    const int newTotalCurrentTime = d->totalCurrentTime.valueBypassingBindings();

    if (newCurrentLoop != oldLoop)
        d->currentLoop.notify();

    /* Notify before calling stop: As seen in tst_QSequentialAnimationGroup::clear
     * we might delete the animation when stop is called. Thus after stop no member
     * of the object must be used anymore.
     */
    if (oldCurrentTime != newTotalCurrentTime)
        d->totalCurrentTime.notify();
    // All animations are responsible for stopping the animation when their
    // own end state is reached; in this case the animation is time driven,
    // and has reached the end.
    if ((currentDirection == Forward && newTotalCurrentTime == totalDura)
        || (currentDirection == Backward && newTotalCurrentTime == 0)) {
        stop();
    }
}